

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O2

bool __thiscall llvm::DWARFVerifier::DieRangeInfo::intersects(DieRangeInfo *this,DieRangeInfo *RHS)

{
  DWARFAddressRange *pDVar1;
  pointer pDVar2;
  DWARFAddressRange *this_00;
  pointer RHS_00;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  
  this_00 = (this->Ranges).
            super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pDVar1 = (this->Ranges).
           super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  RHS_00 = (RHS->Ranges).
           super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar2 = (RHS->Ranges).
           super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    bVar4 = this_00 != pDVar1;
    bVar5 = RHS_00 != pDVar2;
    bVar3 = bVar5 && bVar4;
    if (!bVar5 || !bVar4) {
      return bVar3;
    }
    bVar4 = DWARFAddressRange::intersects(this_00,RHS_00);
    if (bVar4) break;
    if (this_00->LowPC < RHS_00->LowPC) {
      this_00 = this_00 + 1;
    }
    else {
      RHS_00 = RHS_00 + 1;
    }
  }
  return bVar3;
}

Assistant:

bool DWARFVerifier::DieRangeInfo::intersects(const DieRangeInfo &RHS) const {
  auto I1 = Ranges.begin(), E1 = Ranges.end();
  auto I2 = RHS.Ranges.begin(), E2 = RHS.Ranges.end();
  while (I1 != E1 && I2 != E2) {
    if (I1->intersects(*I2))
      return true;
    if (I1->LowPC < I2->LowPC)
      ++I1;
    else
      ++I2;
  }
  return false;
}